

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O1

void calc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options *opt)

{
  bool *pbVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  long *plVar12;
  ostream *poVar13;
  long lVar14;
  invalid_argument *this;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_R9;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_2UL>
  beta;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  f;
  real_t Tmin;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f0;
  real_t Tmax;
  real_t dT;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> f1;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> b0;
  undefined1 local_d78 [8];
  type pnStack_d70;
  uint local_d68;
  undefined1 auStack_d64 [4];
  undefined1 auStack_d60 [8];
  uint local_d58;
  undefined1 auStack_d54 [4];
  undefined1 auStack_d50 [8];
  uint local_d48;
  undefined1 auStack_d44 [4];
  undefined1 auStack_d40 [5];
  undefined3 uStack_d3b;
  int iStack_d38;
  bool abStack_d34 [4];
  undefined1 local_d30 [8];
  undefined1 auStack_d28 [8];
  undefined1 local_d20 [8];
  ulong local_d18;
  uint auStack_d10 [12];
  undefined5 uStack_ce0;
  undefined3 uStack_cdb;
  int iStack_cd8;
  undefined1 uStack_cd4;
  undefined8 local_cd0;
  expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_c28;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_c18;
  uint local_c08 [2];
  uint auStack_c00 [2];
  uint local_bf8 [2];
  uint auStack_bf0 [2];
  uint local_be8 [2];
  undefined8 uStack_be0;
  int local_bd8;
  undefined1 local_bd4;
  undefined4 local_bd0;
  free_energy afStack_bcc [4];
  cpp_dec_float<100U,_int,_void> local_bc8 [3];
  cpp_dec_float<100U,_int,_void> local_ad8;
  cpp_dec_float<100U,_int,_void> local_a88;
  cpp_dec_float<100U,_int,_void> local_a38;
  cpp_dec_float<100U,_int,_void> local_9e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_998;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_948;
  triangular local_8f8 [8];
  uint auStack_8f0 [2];
  uint local_8e8 [2];
  uint auStack_8e0 [2];
  uint local_8d8 [2];
  uint auStack_8d0 [2];
  uint local_8c8 [2];
  undefined8 uStack_8c0;
  int local_8b8;
  undefined1 local_8b4;
  fpclass_type local_8b0;
  int32_t iStack_8ac;
  multiply_immediates local_8a8 [8];
  uint auStack_8a0 [2];
  uint local_898 [2];
  uint auStack_890 [2];
  uint local_888 [2];
  uint auStack_880 [2];
  uint local_878 [2];
  undefined8 uStack_870;
  int local_868;
  undefined1 local_864;
  fpclass_type local_860;
  int32_t iStack_85c;
  undefined1 local_858 [80];
  cpp_dec_float<100U,_int,_void> local_808;
  cpp_dec_float<100U,_int,_void> local_7b8;
  cpp_dec_float<100U,_int,_void> local_768;
  undefined4 uStack_718;
  undefined1 auStack_714 [4];
  undefined1 local_710 [176];
  free_energy afStack_660 [8];
  free_energy afStack_658 [8];
  free_energy afStack_650 [8];
  free_energy afStack_648 [8];
  free_energy afStack_640 [8];
  free_energy afStack_638 [8];
  free_energy afStack_630 [8];
  free_energy afStack_628 [4];
  free_energy afStack_624 [4];
  free_energy local_620 [168];
  undefined8 auStack_578 [8];
  undefined4 uStack_538;
  undefined1 auStack_534 [4];
  undefined1 local_530 [240];
  undefined1 local_440 [240];
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  local_350;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_260 [3];
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_170;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_120;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_d0;
  get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)> local_80;
  
  local_9e8.fpclass = cpp_dec_float_finite;
  local_9e8.prec_elem = 0x10;
  local_9e8.data._M_elems[0] = 0;
  local_9e8.data._M_elems[1] = 0;
  local_9e8.data._M_elems[2] = 0;
  local_9e8.data._M_elems[3] = 0;
  local_9e8.data._M_elems[4] = 0;
  local_9e8.data._M_elems[5] = 0;
  local_9e8.data._M_elems[6] = 0;
  local_9e8.data._M_elems[7] = 0;
  local_9e8.data._M_elems[8] = 0;
  local_9e8.data._M_elems[9] = 0;
  local_9e8.data._M_elems[10] = 0;
  local_9e8.data._M_elems[0xb] = 0;
  local_9e8.data._M_elems[0xc] = 0;
  local_9e8.data._M_elems[0xd] = 0;
  local_9e8.data._M_elems._56_5_ = 0;
  local_9e8.data._M_elems[0xf]._1_3_ = 0;
  local_9e8.exp = 0;
  local_9e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_9e8,(opt->Ja)._M_dataplus._M_p);
  local_a38.fpclass = cpp_dec_float_finite;
  local_a38.prec_elem = 0x10;
  local_a38.data._M_elems[0] = 0;
  local_a38.data._M_elems[1] = 0;
  local_a38.data._M_elems[2] = 0;
  local_a38.data._M_elems[3] = 0;
  local_a38.data._M_elems[4] = 0;
  local_a38.data._M_elems[5] = 0;
  local_a38.data._M_elems[6] = 0;
  local_a38.data._M_elems[7] = 0;
  local_a38.data._M_elems[8] = 0;
  local_a38.data._M_elems[9] = 0;
  local_a38.data._M_elems[10] = 0;
  local_a38.data._M_elems[0xb] = 0;
  local_a38.data._M_elems[0xc] = 0;
  local_a38.data._M_elems[0xd] = 0;
  local_a38.data._M_elems._56_5_ = 0;
  local_a38.data._M_elems[0xf]._1_3_ = 0;
  local_a38.exp = 0;
  local_a38.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_a38,(opt->Jb)._M_dataplus._M_p);
  local_a88.fpclass = cpp_dec_float_finite;
  local_a88.prec_elem = 0x10;
  local_a88.data._M_elems[0] = 0;
  local_a88.data._M_elems[1] = 0;
  local_a88.data._M_elems[2] = 0;
  local_a88.data._M_elems[3] = 0;
  local_a88.data._M_elems[4] = 0;
  local_a88.data._M_elems[5] = 0;
  local_a88.data._M_elems[6] = 0;
  local_a88.data._M_elems[7] = 0;
  local_a88.data._M_elems[8] = 0;
  local_a88.data._M_elems[9] = 0;
  local_a88.data._M_elems[10] = 0;
  local_a88.data._M_elems[0xb] = 0;
  local_a88.data._M_elems[0xc] = 0;
  local_a88.data._M_elems[0xd] = 0;
  local_a88.data._M_elems._56_5_ = 0;
  local_a88.data._M_elems[0xf]._1_3_ = 0;
  local_a88.exp = 0;
  local_a88.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_a88,(opt->Jc)._M_dataplus._M_p);
  local_ad8.fpclass = cpp_dec_float_finite;
  local_ad8.prec_elem = 0x10;
  local_ad8.data._M_elems[0] = 0;
  local_ad8.data._M_elems[1] = 0;
  local_ad8.data._M_elems[2] = 0;
  local_ad8.data._M_elems[3] = 0;
  local_ad8.data._M_elems[4] = 0;
  local_ad8.data._M_elems[5] = 0;
  local_ad8.data._M_elems[6] = 0;
  local_ad8.data._M_elems[7] = 0;
  local_ad8.data._M_elems[8] = 0;
  local_ad8.data._M_elems[9] = 0;
  local_ad8.data._M_elems[10] = 0;
  local_ad8.data._M_elems[0xb] = 0;
  local_ad8.data._M_elems[0xc] = 0;
  local_ad8.data._M_elems[0xd] = 0;
  local_ad8.data._M_elems._56_5_ = 0;
  local_ad8.data._M_elems[0xf]._1_3_ = 0;
  local_ad8.exp = 0;
  local_ad8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_ad8,(opt->Tmin)._M_dataplus._M_p);
  local_7b8.fpclass = cpp_dec_float_finite;
  local_7b8.prec_elem = 0x10;
  local_7b8.data._M_elems[0] = 0;
  local_7b8.data._M_elems[1] = 0;
  local_7b8.data._M_elems[2] = 0;
  local_7b8.data._M_elems[3] = 0;
  local_7b8.data._M_elems[4] = 0;
  local_7b8.data._M_elems[5] = 0;
  local_7b8.data._M_elems[6] = 0;
  local_7b8.data._M_elems[7] = 0;
  local_7b8.data._M_elems[8] = 0;
  local_7b8.data._M_elems[9] = 0;
  local_7b8.data._M_elems[10] = 0;
  local_7b8.data._M_elems[0xb] = 0;
  local_7b8.data._M_elems[0xc] = 0;
  local_7b8.data._M_elems[0xd] = 0;
  local_7b8.data._M_elems._56_5_ = 0;
  local_7b8.data._M_elems[0xf]._1_3_ = 0;
  local_7b8.exp = 0;
  local_7b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_7b8,(opt->Tmax)._M_dataplus._M_p);
  local_768.fpclass = cpp_dec_float_finite;
  local_768.prec_elem = 0x10;
  local_768.data._M_elems[0] = 0;
  local_768.data._M_elems[1] = 0;
  local_768.data._M_elems[2] = 0;
  local_768.data._M_elems[3] = 0;
  local_768.data._M_elems[4] = 0;
  local_768.data._M_elems[5] = 0;
  local_768.data._M_elems[6] = 0;
  local_768.data._M_elems[7] = 0;
  local_768.data._M_elems[8] = 0;
  local_768.data._M_elems[9] = 0;
  local_768.data._M_elems[10] = 0;
  local_768.data._M_elems[0xb] = 0;
  local_768.data._M_elems[0xc] = 0;
  local_768.data._M_elems[0xd] = 0;
  local_768.data._M_elems._56_5_ = 0;
  local_768.data._M_elems[0xf]._1_3_ = 0;
  local_768.exp = 0;
  local_768.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
            (&local_768,(opt->dT)._M_dataplus._M_p);
  if (((local_ad8.fpclass == cpp_dec_float_NaN) || (local_7b8.fpclass == cpp_dec_float_NaN)) ||
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_ad8,&local_7b8), iVar11 < 1)) {
    local_d18 = local_d18 & 0xffffffff00000000;
    bVar10 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)&local_768,(int *)&local_d18);
    lVar14 = std::cout;
    if (!bVar10) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100
      ;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar14 + -0x18)) = 100;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"# lattice: triangular\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# precision: ",0xd);
      plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cout,100);
      std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
      std::ostream::put((char)plVar12);
      poVar13 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n",0x23);
      local_808.data._M_elems[0xf]._1_3_ = local_ad8.data._M_elems[0xf]._1_3_;
      local_808.data._M_elems._56_5_ = local_ad8.data._M_elems._56_5_;
      local_808.data._M_elems[0xc] = local_ad8.data._M_elems[0xc];
      local_808.data._M_elems[0xd] = local_ad8.data._M_elems[0xd];
      local_808.data._M_elems[8] = local_ad8.data._M_elems[8];
      local_808.data._M_elems[9] = local_ad8.data._M_elems[9];
      local_808.data._M_elems[10] = local_ad8.data._M_elems[10];
      local_808.data._M_elems[0xb] = local_ad8.data._M_elems[0xb];
      local_808.data._M_elems[4] = local_ad8.data._M_elems[4];
      local_808.data._M_elems[5] = local_ad8.data._M_elems[5];
      local_808.data._M_elems[6] = local_ad8.data._M_elems[6];
      local_808.data._M_elems[7] = local_ad8.data._M_elems[7];
      local_808.data._M_elems[0] = local_ad8.data._M_elems[0];
      local_808.data._M_elems[1] = local_ad8.data._M_elems[1];
      local_808.data._M_elems[2] = local_ad8.data._M_elems[2];
      local_808.data._M_elems[3] = local_ad8.data._M_elems[3];
      local_808.exp = local_ad8.exp;
      local_808.neg = local_ad8.neg;
      local_808.fpclass = local_ad8.fpclass;
      local_808.prec_elem = local_ad8.prec_elem;
      while( true ) {
        local_858._8_8_ = &local_768;
        local_858._0_8_ = (type)0x3f1a36e2eb1c432d;
        local_cd0._0_4_ = cpp_dec_float_finite;
        local_cd0._4_4_ = 0x10;
        local_d18 = 0;
        auStack_d10[0] = 0;
        auStack_d10[1] = 0;
        auStack_d10[2] = 0;
        auStack_d10[3] = 0;
        auStack_d10[4] = 0;
        auStack_d10[5] = 0;
        auStack_d10[6] = 0;
        auStack_d10[7] = 0;
        auStack_d10[8] = 0;
        auStack_d10[9] = 0;
        auStack_d10[10] = 0;
        auStack_d10[0xb] = 0;
        uStack_ce0 = 0;
        uStack_cdb = 0;
        iStack_cd8 = 0;
        uStack_cd4 = 0;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,double,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&local_d18,
                   (expression<boost::multiprecision::detail::multiply_immediates,_double,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_858,(multiply_immediates *)&local_170);
        local_d78 = (undefined1  [8])local_d18;
        pnStack_d70 = (type)auStack_d10._0_8_;
        local_d68 = auStack_d10[2];
        auStack_d64 = (undefined1  [4])auStack_d10[3];
        auStack_d60._0_4_ = auStack_d10[4];
        auStack_d60._4_4_ = auStack_d10[5];
        local_d58 = auStack_d10[6];
        auStack_d54 = (undefined1  [4])auStack_d10[7];
        auStack_d50._0_4_ = auStack_d10[8];
        auStack_d50._4_4_ = auStack_d10[9];
        local_d48 = auStack_d10[10];
        auStack_d44 = (undefined1  [4])auStack_d10[0xb];
        auStack_d40 = (undefined1  [5])uStack_ce0;
        uStack_d3b = uStack_cdb;
        iStack_d38 = iStack_cd8;
        abStack_d34[0] = (bool)uStack_cd4;
        local_d30._0_4_ = (fpclass_type)local_cd0;
        local_d30._4_4_ = local_cd0._4_4_;
        local_858._0_8_ = &local_7b8;
        local_cd0._0_4_ = cpp_dec_float_finite;
        local_cd0._4_4_ = 0x10;
        local_d18 = 0;
        auStack_d10[0] = 0;
        auStack_d10[1] = 0;
        auStack_d10[2] = 0;
        auStack_d10[3] = 0;
        auStack_d10[4] = 0;
        auStack_d10[5] = 0;
        auStack_d10[6] = 0;
        auStack_d10[7] = 0;
        auStack_d10[8] = 0;
        auStack_d10[9] = 0;
        auStack_d10[10] = 0;
        auStack_d10[0xb] = 0;
        uStack_ce0 = 0;
        uStack_cdb = 0;
        iStack_cd8 = 0;
        uStack_cd4 = 0;
        local_858._8_8_ = (type)local_d78;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)&local_d18,
                   (expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)local_858,(add_immediates *)&local_170);
        local_bc8[0].data._M_elems[0xf]._1_3_ = uStack_cdb;
        local_bc8[0].data._M_elems._56_5_ = uStack_ce0;
        local_bc8[0].data._M_elems[0] = (undefined4)local_d18;
        local_bc8[0].data._M_elems[1] = local_d18._4_4_;
        local_bc8[0].data._M_elems[2] = auStack_d10[0];
        local_bc8[0].data._M_elems[3] = auStack_d10[1];
        local_bc8[0].data._M_elems[4] = auStack_d10[2];
        local_bc8[0].data._M_elems[5] = auStack_d10[3];
        local_bc8[0].data._M_elems[6] = auStack_d10[4];
        local_bc8[0].data._M_elems[7] = auStack_d10[5];
        local_bc8[0].data._M_elems[8] = auStack_d10[6];
        local_bc8[0].data._M_elems[9] = auStack_d10[7];
        local_bc8[0].data._M_elems[10] = auStack_d10[8];
        local_bc8[0].data._M_elems[0xb] = auStack_d10[9];
        local_bc8[0].data._M_elems[0xc] = auStack_d10[10];
        local_bc8[0].data._M_elems[0xd] = auStack_d10[0xb];
        local_bc8[0].exp = iStack_cd8;
        local_bc8[0].neg = (bool)uStack_cd4;
        local_bc8[0].fpclass = (fpclass_type)local_cd0;
        local_bc8[0].prec_elem = local_cd0._4_4_;
        if ((local_808.fpclass == cpp_dec_float_NaN) ||
           ((fpclass_type)local_cd0 == cpp_dec_float_NaN)) break;
        iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_808,local_bc8);
        if (-1 < iVar11) {
          return;
        }
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)local_bc8,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_808);
        lVar14 = 0x4c;
        do {
          *(undefined8 *)(local_d20 + lVar14 + 4) = 0x1000000000;
          *(undefined8 *)(auStack_d64 + lVar14) = 0;
          *(undefined8 *)(auStack_d60 + lVar14 + 4) = 0;
          *(undefined8 *)(auStack_d54 + lVar14) = 0;
          *(undefined8 *)(auStack_d50 + lVar14 + 4) = 0;
          *(undefined8 *)(auStack_d40 + lVar14 + -4) = 0;
          *(undefined8 *)(auStack_d40 + lVar14 + 4) = 0;
          pbVar1 = abStack_d34 + lVar14;
          pbVar1[0] = false;
          pbVar1[1] = false;
          pbVar1[2] = false;
          pbVar1[3] = false;
          pbVar1[4] = false;
          pbVar1[5] = false;
          pbVar1[6] = false;
          pbVar1[7] = false;
          *(undefined8 *)(auStack_d28 + lVar14 + -4) = 0;
          *(undefined8 *)(auStack_d28 + lVar14 + 1) = 0;
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x13c);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>
        ::
        fvar_cpp11<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                  ((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>
                    *)&local_d18,local_bc8,1);
        local_8f8 = (triangular  [8])local_9e8.data._M_elems._0_8_;
        auStack_8f0[0] = local_9e8.data._M_elems[2];
        auStack_8f0[1] = local_9e8.data._M_elems[3];
        local_8e8[0] = local_9e8.data._M_elems[4];
        local_8e8[1] = local_9e8.data._M_elems[5];
        auStack_8e0[0] = local_9e8.data._M_elems[6];
        auStack_8e0[1] = local_9e8.data._M_elems[7];
        local_8d8[0] = local_9e8.data._M_elems[8];
        local_8d8[1] = local_9e8.data._M_elems[9];
        auStack_8d0[0] = local_9e8.data._M_elems[10];
        auStack_8d0[1] = local_9e8.data._M_elems[0xb];
        local_8c8[0] = local_9e8.data._M_elems[0xc];
        local_8c8[1] = local_9e8.data._M_elems[0xd];
        uStack_8c0 = CONCAT35(local_9e8.data._M_elems[0xf]._1_3_,local_9e8.data._M_elems._56_5_);
        local_8b8 = local_9e8.exp;
        local_8b4 = local_9e8.neg;
        local_8b0 = local_9e8.fpclass;
        iStack_8ac = local_9e8.prec_elem;
        uVar4._5_3_ = local_a38.data._M_elems[0xf]._1_3_;
        uVar4._0_5_ = local_a38.data._M_elems._56_5_;
        local_948.base.m_backend.data._M_elems[0] = local_a38.data._M_elems[0];
        local_948.base.m_backend.data._M_elems[1] = local_a38.data._M_elems[1];
        local_948.base.m_backend.data._M_elems[2] = local_a38.data._M_elems[2];
        local_948.base.m_backend.data._M_elems[3] = local_a38.data._M_elems[3];
        local_948.base.m_backend.data._M_elems[4] = local_a38.data._M_elems[4];
        local_948.base.m_backend.data._M_elems[5] = local_a38.data._M_elems[5];
        local_948.base.m_backend.data._M_elems[6] = local_a38.data._M_elems[6];
        local_948.base.m_backend.data._M_elems[7] = local_a38.data._M_elems[7];
        local_948.base.m_backend.data._M_elems[8] = local_a38.data._M_elems[8];
        local_948.base.m_backend.data._M_elems[9] = local_a38.data._M_elems[9];
        local_948.base.m_backend.data._M_elems[10] = local_a38.data._M_elems[10];
        local_948.base.m_backend.data._M_elems[0xb] = local_a38.data._M_elems[0xb];
        local_948.base.m_backend.data._M_elems[0xc] = local_a38.data._M_elems[0xc];
        local_948.base.m_backend.data._M_elems[0xd] = local_a38.data._M_elems[0xd];
        local_948.base.m_backend.data._M_elems[0xe] = local_a38.data._M_elems[0xe];
        local_948.base.m_backend.data._M_elems[0xf] = SUB84(uVar4,4);
        local_948.base.m_backend.exp = local_a38.exp;
        local_948.base.m_backend.neg = local_a38.neg;
        local_948.base.m_backend.fpclass = local_a38.fpclass;
        local_948.base.m_backend.prec_elem = local_a38.prec_elem;
        uVar3._5_3_ = local_a88.data._M_elems[0xf]._1_3_;
        uVar3._0_5_ = local_a88.data._M_elems._56_5_;
        local_998.base.m_backend.data._M_elems[0] = local_a88.data._M_elems[0];
        local_998.base.m_backend.data._M_elems[1] = local_a88.data._M_elems[1];
        local_998.base.m_backend.data._M_elems[2] = local_a88.data._M_elems[2];
        local_998.base.m_backend.data._M_elems[3] = local_a88.data._M_elems[3];
        local_998.base.m_backend.data._M_elems[4] = local_a88.data._M_elems[4];
        local_998.base.m_backend.data._M_elems[5] = local_a88.data._M_elems[5];
        local_998.base.m_backend.data._M_elems[6] = local_a88.data._M_elems[6];
        local_998.base.m_backend.data._M_elems[7] = local_a88.data._M_elems[7];
        local_998.base.m_backend.data._M_elems[8] = local_a88.data._M_elems[8];
        local_998.base.m_backend.data._M_elems[9] = local_a88.data._M_elems[9];
        local_998.base.m_backend.data._M_elems[10] = local_a88.data._M_elems[10];
        local_998.base.m_backend.data._M_elems[0xb] = local_a88.data._M_elems[0xb];
        local_998.base.m_backend.data._M_elems[0xc] = local_a88.data._M_elems[0xc];
        local_998.base.m_backend.data._M_elems[0xd] = local_a88.data._M_elems[0xd];
        local_998.base.m_backend.data._M_elems[0xe] = local_a88.data._M_elems[0xe];
        local_998.base.m_backend.data._M_elems[0xf] = SUB84(uVar3,4);
        local_998.base.m_backend.exp = local_a88.exp;
        local_998.base.m_backend.neg = local_a88.neg;
        local_998.base.m_backend.fpclass = local_a88.fpclass;
        local_998.base.m_backend.prec_elem = local_a88.prec_elem;
        lVar14 = 0x48;
        do {
          uVar3 = *(undefined8 *)(auStack_d60 + lVar14);
          uVar4 = *(undefined8 *)((long)&local_d58 + lVar14);
          uVar5 = *(undefined8 *)(auStack_d50 + lVar14);
          uVar6 = *(undefined8 *)(auStack_d40 + lVar14 + -8);
          uVar7 = *(undefined8 *)(auStack_d40 + lVar14);
          uVar8 = *(undefined8 *)(abStack_d34 + lVar14 + -4);
          uVar9 = *(undefined8 *)(auStack_d28 + lVar14);
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x18) =
               *(undefined8 *)(auStack_d28 + lVar14 + -8);
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x10) = uVar9;
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x28) = uVar7;
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x20) = uVar8;
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x38) = uVar5;
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x30) = uVar6;
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -0x48) = uVar3;
          *(undefined8 *)((long)(&local_260[0].base.m_backend.data + -1) + lVar14) = uVar4;
          *(undefined4 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -8) =
               *(undefined4 *)(local_d20 + lVar14);
          *(undefined1 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14 + -4) =
               local_d20[lVar14 + 4];
          *(undefined8 *)((long)local_260[0].base.m_backend.data._M_elems + lVar14) =
               *(undefined8 *)((long)&local_d18 + lVar14);
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x138);
        ising::free_energy::triangular::
        infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                  ((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *)local_bc8,local_8f8,&local_948,&local_998,local_260,in_R9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inf inf ",8);
        poVar13 = boost::multiprecision::operator<<
                            ((ostream *)&std::cout,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_9e8);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        poVar13 = boost::multiprecision::operator<<
                            (poVar13,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                      *)&local_a38);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        poVar13 = boost::multiprecision::operator<<
                            (poVar13,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                      *)&local_a88);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        poVar13 = boost::multiprecision::operator<<
                            (poVar13,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                      *)&local_808);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        operator/(&local_d0,1,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_808);
        poVar13 = boost::multiprecision::operator<<(poVar13,&local_d0.base);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        lVar14 = 0x48;
        do {
          uVar3 = *(undefined8 *)((long)local_c08 + lVar14 + -8);
          uVar4 = *(undefined8 *)((long)local_c08 + lVar14);
          uVar5 = *(undefined8 *)((long)auStack_c00 + lVar14);
          uVar6 = *(undefined8 *)((long)local_bf8 + lVar14);
          uVar7 = *(undefined8 *)((long)auStack_bf0 + lVar14);
          uVar8 = *(undefined8 *)((long)local_be8 + lVar14);
          uVar9 = *(undefined8 *)((long)&local_bd8 + lVar14);
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x18) =
               *(undefined8 *)((long)&uStack_be0 + lVar14);
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x10) =
               uVar9;
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x28) =
               uVar7;
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x20) =
               uVar8;
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x38) =
               uVar5;
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x30) =
               uVar6;
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x48) =
               uVar3;
          *(undefined8 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -0x40) =
               uVar4;
          *(undefined4 *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -8) =
               *(undefined4 *)((long)&local_bd0 + lVar14);
          *(free_energy *)((long)&local_350.v._M_elems[0].base.m_backend.data + lVar14 + -4) =
               afStack_bcc[lVar14];
          *(undefined8 *)((long)local_350.v._M_elems[0].base.m_backend.data._M_elems + lVar14) =
               *(undefined8 *)((long)local_bc8[0].data._M_elems + lVar14);
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x138);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
        ::derivative<int>(&local_120,&local_350,0);
        poVar13 = boost::multiprecision::operator<<(poVar13,&local_120.base);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        local_d20 = (undefined1  [8])
                    std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        lVar14 = 0x48;
        do {
          uVar3 = *(undefined8 *)((long)local_c08 + lVar14 + -8);
          uVar4 = *(undefined8 *)((long)local_c08 + lVar14);
          uVar5 = *(undefined8 *)((long)auStack_c00 + lVar14);
          uVar6 = *(undefined8 *)((long)local_bf8 + lVar14);
          uVar7 = *(undefined8 *)((long)auStack_bf0 + lVar14);
          uVar8 = *(undefined8 *)((long)local_be8 + lVar14);
          uVar9 = *(undefined8 *)((long)&local_bd8 + lVar14);
          *(undefined8 *)(local_440 + lVar14 + -0x18) = *(undefined8 *)((long)&uStack_be0 + lVar14);
          *(undefined8 *)(local_440 + lVar14 + -0x10) = uVar9;
          *(undefined8 *)(local_440 + lVar14 + -0x28) = uVar7;
          *(undefined8 *)(local_440 + lVar14 + -0x20) = uVar8;
          *(undefined8 *)(local_440 + lVar14 + -0x38) = uVar5;
          *(undefined8 *)(local_440 + lVar14 + -0x30) = uVar6;
          *(undefined8 *)(local_440 + lVar14 + -0x48) = uVar3;
          *(undefined8 *)(local_440 + lVar14 + -0x40) = uVar4;
          *(undefined4 *)(local_440 + lVar14 + -8) = *(undefined4 *)((long)&local_bd0 + lVar14);
          *(free_energy *)(local_440 + lVar14 + -4) = afStack_bcc[lVar14];
          *(undefined8 *)(local_440 + lVar14) =
               *(undefined8 *)((long)local_bc8[0].data._M_elems + lVar14);
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x138);
        lVar14 = 0x48;
        do {
          uVar3 = *(undefined8 *)(auStack_d60 + lVar14);
          uVar4 = *(undefined8 *)((long)&local_d58 + lVar14);
          uVar5 = *(undefined8 *)(auStack_d50 + lVar14);
          uVar6 = *(undefined8 *)(auStack_d40 + lVar14 + -8);
          uVar7 = *(undefined8 *)(auStack_d40 + lVar14);
          uVar8 = *(undefined8 *)(abStack_d34 + lVar14 + -4);
          uVar9 = *(undefined8 *)(auStack_d28 + lVar14);
          *(undefined8 *)((long)auStack_578 + lVar14 + 0x30) =
               *(undefined8 *)(auStack_d28 + lVar14 + -8);
          *(undefined8 *)((long)auStack_578 + lVar14 + 0x38) = uVar9;
          *(undefined8 *)((long)auStack_578 + lVar14 + 0x20) = uVar7;
          *(undefined8 *)((long)auStack_578 + lVar14 + 0x28) = uVar8;
          *(undefined8 *)((long)auStack_578 + lVar14 + 0x10) = uVar5;
          *(undefined8 *)((long)auStack_578 + lVar14 + 0x18) = uVar6;
          *(undefined8 *)((long)auStack_578 + lVar14) = uVar3;
          *(undefined8 *)((long)auStack_578 + lVar14 + 8) = uVar4;
          *(undefined4 *)((long)&uStack_538 + lVar14) = *(undefined4 *)(local_d20 + lVar14);
          auStack_534[lVar14] = local_d20[lVar14 + 4];
          *(undefined8 *)(local_530 + lVar14) = *(undefined8 *)((long)&local_d18 + lVar14);
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x138);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
        ::derivative<int>((get_type_at<fvar<mp_wrapper<number<cpp_dec_float<100U>_>_>,_2UL>,_sizeof___(Orders)>
                           *)local_858,
                          (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                           *)local_440,0);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
        ::derivative<int>(&local_170,
                          (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                           *)local_440,1);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
        ::derivative<int>(&local_80,
                          (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                           *)local_530,0);
        local_d30._0_4_ = cpp_dec_float_finite;
        local_d30._4_4_ = 0x10;
        local_d78._0_4_ = 0;
        local_d78._4_4_ = 0;
        pnStack_d70 = (type)0x0;
        local_d68 = 0;
        auStack_d64 = (undefined1  [4])0x0;
        auStack_d60._0_4_ = 0;
        auStack_d60._4_4_ = 0;
        local_d58 = 0;
        auStack_d54 = (undefined1  [4])0x0;
        auStack_d50._0_4_ = 0;
        auStack_d50._4_4_ = 0;
        local_d48 = 0;
        auStack_d44 = (undefined1  [4])0x0;
        auStack_d40 = (undefined1  [5])0x0;
        uStack_d3b = 0;
        iStack_d38 = 0;
        abStack_d34[0] = false;
        local_c18.arg1 = &local_80.base;
        local_c18.arg2 = &local_170.base;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)local_d78,&local_c18,local_8a8);
        uStack_870 = CONCAT35(uStack_d3b,auStack_d40);
        local_8a8[0] = (multiply_immediates)local_d78[0];
        local_8a8[1] = (multiply_immediates)local_d78[1];
        local_8a8[2] = (multiply_immediates)local_d78[2];
        local_8a8[3] = (multiply_immediates)local_d78[3];
        local_8a8[4] = (multiply_immediates)local_d78[4];
        local_8a8[5] = (multiply_immediates)local_d78[5];
        local_8a8[6] = (multiply_immediates)local_d78[6];
        local_8a8[7] = (multiply_immediates)local_d78[7];
        auStack_8a0 = (uint  [2])pnStack_d70;
        local_898[0] = local_d68;
        local_898[1] = (uint)auStack_d64;
        auStack_890[0] = auStack_d60._0_4_;
        auStack_890[1] = auStack_d60._4_4_;
        local_888[0] = local_d58;
        local_888[1] = (uint)auStack_d54;
        auStack_880[0] = auStack_d50._0_4_;
        auStack_880[1] = auStack_d50._4_4_;
        local_878[0] = local_d48;
        local_878[1] = (uint)auStack_d44;
        local_868 = iStack_d38;
        local_864 = abStack_d34[0];
        local_860 = local_d30._0_4_;
        iStack_85c = local_d30._4_4_;
        local_d30._0_4_ = cpp_dec_float_finite;
        local_d30._4_4_ = 0x10;
        local_d78 = (undefined1  [8])0x0;
        pnStack_d70 = (type)0x0;
        local_d68 = 0;
        auStack_d64 = (undefined1  [4])0x0;
        auStack_d60._0_4_ = 0;
        auStack_d60._4_4_ = 0;
        local_d58 = 0;
        auStack_d54 = (undefined1  [4])0x0;
        auStack_d50._0_4_ = 0;
        auStack_d50._4_4_ = 0;
        local_d48 = 0;
        auStack_d44 = (undefined1  [4])0x0;
        auStack_d40 = (undefined1  [5])0x0;
        uStack_d3b = 0;
        iStack_d38 = 0;
        abStack_d34[0] = false;
        local_c28.arg1 = (type)local_858;
        local_c28.arg2 = (type)local_8a8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                    *)local_d78,&local_c28,(add_immediates *)&local_c18);
        uStack_be0 = CONCAT35(uStack_d3b,auStack_d40);
        local_c18.arg1 = (type)local_d78;
        local_c18.arg2 = pnStack_d70;
        local_c08[0] = local_d68;
        local_c08[1] = (uint)auStack_d64;
        auStack_c00[0] = auStack_d60._0_4_;
        auStack_c00[1] = auStack_d60._4_4_;
        local_bf8[0] = local_d58;
        local_bf8[1] = (uint)auStack_d54;
        auStack_bf0[0] = auStack_d50._0_4_;
        auStack_bf0[1] = auStack_d50._4_4_;
        local_be8[0] = local_d48;
        local_be8[1] = (uint)auStack_d44;
        local_bd8 = iStack_d38;
        local_bd4 = abStack_d34[0];
        local_bd0 = local_d30._0_4_;
        afStack_bcc = (free_energy  [4])local_d30._4_4_;
        poVar13 = boost::multiprecision::operator<<
                            ((ostream *)local_d20,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_c18);
        local_d78[0] = (number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                        )0x20;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_d78,1);
        lVar14 = 0x48;
        do {
          uVar3 = *(undefined8 *)((long)local_c08 + lVar14 + -8);
          uVar4 = *(undefined8 *)((long)local_c08 + lVar14);
          uVar5 = *(undefined8 *)((long)auStack_c00 + lVar14);
          uVar6 = *(undefined8 *)((long)local_bf8 + lVar14);
          uVar7 = *(undefined8 *)((long)auStack_bf0 + lVar14);
          uVar8 = *(undefined8 *)((long)local_be8 + lVar14);
          uVar9 = *(undefined8 *)((long)&local_bd8 + lVar14);
          *(undefined8 *)(local_620 + lVar14 + -0x18) = *(undefined8 *)((long)&uStack_be0 + lVar14);
          *(undefined8 *)(local_620 + lVar14 + -0x10) = uVar9;
          *(undefined8 *)(local_620 + lVar14 + -0x28) = uVar7;
          *(undefined8 *)(local_620 + lVar14 + -0x20) = uVar8;
          *(undefined8 *)(local_620 + lVar14 + -0x38) = uVar5;
          *(undefined8 *)(local_620 + lVar14 + -0x30) = uVar6;
          *(undefined8 *)(local_620 + lVar14 + -0x48) = uVar3;
          *(undefined8 *)(local_620 + lVar14 + -0x40) = uVar4;
          *(undefined4 *)(local_620 + lVar14 + -8) = *(undefined4 *)((long)&local_bd0 + lVar14);
          local_620[lVar14 + -4] = afStack_bcc[lVar14];
          *(undefined8 *)(local_620 + lVar14) =
               *(undefined8 *)((long)local_bc8[0].data._M_elems + lVar14);
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x138);
        lVar14 = 0x48;
        do {
          uVar3 = *(undefined8 *)(auStack_d60 + lVar14);
          uVar4 = *(undefined8 *)((long)&local_d58 + lVar14);
          uVar5 = *(undefined8 *)(auStack_d50 + lVar14);
          uVar6 = *(undefined8 *)(auStack_d40 + lVar14 + -8);
          uVar7 = *(undefined8 *)(auStack_d40 + lVar14);
          uVar8 = *(undefined8 *)(abStack_d34 + lVar14 + -4);
          uVar9 = *(undefined8 *)(auStack_d28 + lVar14);
          *(undefined8 *)((long)(&local_768.data + 1) + lVar14) =
               *(undefined8 *)(auStack_d28 + lVar14 + -8);
          *(undefined8 *)((long)(&local_768.data + 1) + lVar14 + 8) = uVar9;
          *(undefined8 *)((long)local_768.data._M_elems + lVar14 + 0x30) = uVar7;
          *(undefined8 *)((long)local_768.data._M_elems + lVar14 + 0x38) = uVar8;
          *(undefined8 *)((long)local_768.data._M_elems + lVar14 + 0x20) = uVar5;
          *(undefined8 *)((long)local_768.data._M_elems + lVar14 + 0x28) = uVar6;
          *(undefined8 *)((long)local_768.data._M_elems + lVar14 + 0x10) = uVar3;
          *(undefined8 *)((long)local_768.data._M_elems + lVar14 + 0x18) = uVar4;
          *(undefined4 *)((long)&uStack_718 + lVar14) = *(undefined4 *)(local_d20 + lVar14);
          auStack_714[lVar14] = local_d20[lVar14 + 4];
          puVar2 = (undefined8 *)((long)&local_d18 + lVar14);
          *(fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
            **)(local_710 + lVar14) =
               (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                *)*puVar2;
          lVar14 = lVar14 + 0x50;
        } while (lVar14 != 0x138);
        ising::free_energy::
        specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                  ((root_type *)local_d78,local_620,
                   (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *)local_710,
                   (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                    *)*puVar2);
        poVar13 = boost::multiprecision::operator<<
                            (poVar13,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                      *)local_d78);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_808,&local_768);
      }
      return;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"dT should be positive");
  }
  else {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}